

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyroot.c
# Opt level: O1

int polyroot(double *coeff,int DEGREE,double *ZEROR,double *ZEROI)

{
  size_t __size;
  int iVar1;
  double *OPR;
  double *OPI;
  double *pdVar2;
  long lVar3;
  ulong uVar4;
  
  __size = (long)DEGREE * 8 + 8;
  OPR = (double *)malloc(__size);
  OPI = (double *)malloc(__size);
  if (-1 < DEGREE) {
    uVar4 = (ulong)(uint)DEGREE;
    lVar3 = 0;
    memset(OPI,0,uVar4 * 8 + 8);
    pdVar2 = coeff + uVar4;
    do {
      OPR[lVar3] = *pdVar2;
      lVar3 = lVar3 + 1;
      pdVar2 = pdVar2 + -1;
    } while (uVar4 + 1 != lVar3);
  }
  iVar1 = cpoly(OPR,OPI,DEGREE,ZEROR,ZEROI);
  free(OPR);
  free(OPI);
  return iVar1;
}

Assistant:

int polyroot(double *coeff, int DEGREE, double *ZEROR, double *ZEROI) {
	/*
	Input - coeff[0] + coeff[1] * x^1 + coeff[2] * x^2 + ---- + coeff[DEGREE+1] * x^DEGREE 

	The program fails if there are leading zeros. Check return value.

	Return Value = 0 -> Probable Success
	Return Value = 1 -> Likely Failure
	*/
	int fail,i,N;
	double *OPR, *OPI;

	N = DEGREE + 1;
	OPR = (double*)malloc(sizeof(double)* N);
	OPI = (double*)malloc(sizeof(double)* N);

	for (i = 0; i < N; ++i) {
		OPR[i] = coeff[N - 1 - i];
		OPI[i] = 0.0;
	}
	fail = cpoly(OPR, OPI, DEGREE, ZEROR, ZEROI);

	free(OPR);
	free(OPI);
	return fail;
}